

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_server_discovery.c
# Opt level: O1

pcp_errno psd_add_pcp_server(pcp_ctx_t *ctx,sockaddr *sa,uint8_t version)

{
  int pcp_server_index;
  pcp_errno pVar1;
  pcp_server_t *s;
  char *pcVar2;
  uint32_t scope_id;
  char *fmt;
  pcp_loglvl_e log_level;
  uint16_t port;
  in6_addr pcp_ip;
  anon_union_16_3_a3f0114d_for___in6_u local_38;
  
  if (sa->sa_family == 2) {
    local_38._0_8_ = 0;
    local_38.__u6_addr32[3] = *(undefined4 *)(sa->sa_data + 2);
    local_38.__u6_addr32[2] = 0xffff0000;
    scope_id = 0;
  }
  else {
    local_38._0_8_ = *(undefined8 *)(sa->sa_data + 6);
    local_38._8_2_ = sa[1].sa_family;
    local_38._10_1_ = sa[1].sa_data[0];
    local_38._11_1_ = sa[1].sa_data[1];
    local_38._12_1_ = sa[1].sa_data[2];
    local_38._13_1_ = sa[1].sa_data[3];
    local_38._14_1_ = sa[1].sa_data[4];
    local_38._15_1_ = sa[1].sa_data[5];
    scope_id = *(uint32_t *)(sa[1].sa_data + 6);
  }
  port = 0xe714;
  if (*(uint16_t *)sa->sa_data != 0) {
    port = *(uint16_t *)sa->sa_data;
  }
  s = get_pcp_server_by_ip(ctx,(in6_addr *)&local_38,scope_id);
  if (s == (pcp_server_t *)0x0) {
    pcp_server_index = pcp_new_server(ctx,(in6_addr *)&local_38,port,scope_id);
    if (pcp_server_index < 0) {
      s = (pcp_server_t *)0x0;
    }
    else {
      s = get_pcp_server(ctx,pcp_server_index);
    }
    if (s == (pcp_server_t *)0x0) {
      fmt = "%s";
      pcVar2 = "Can\'t add PCP server.\n";
      log_level = PCP_LOGLVL_ERR;
      goto LAB_0010699d;
    }
  }
  else {
    s->pcp_port = port;
  }
  s->pcp_version = version;
  s->server_state = pss_allocated;
  pVar1 = psd_fill_pcp_server_src(s);
  if (pVar1 == PCP_ERR_SUCCESS) {
    pcp_logger(PCP_LOGLVL_INFO,"Added PCP server %s",s->pcp_server_paddr);
    return s->index;
  }
  s->server_state = pss_unitialized;
  pcVar2 = s->pcp_server_paddr;
  fmt = "Failed to add PCP server %s";
  log_level = PCP_LOGLVL_INFO;
LAB_0010699d:
  pcp_logger(log_level,fmt,pcVar2);
  return PCP_ERR_UNKNOWN;
}

Assistant:

pcp_errno psd_add_pcp_server(pcp_ctx_t *ctx, struct sockaddr *sa,
                             uint8_t version) {
    struct in6_addr pcp_ip = IN6ADDR_ANY_INIT;
    uint16_t pcp_port;
    uint32_t scope_id = 0;
    pcp_server_t *pcps = NULL;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (sa->sa_family == AF_INET) {
        S6_ADDR32(&pcp_ip)[0] = 0;
        S6_ADDR32(&pcp_ip)[1] = 0;
        S6_ADDR32(&pcp_ip)[2] = htonl(0xFFFF);
        S6_ADDR32(&pcp_ip)[3] = ((struct sockaddr_in *)sa)->sin_addr.s_addr;
        pcp_port = ((struct sockaddr_in *)sa)->sin_port;
    } else {
        IPV6_ADDR_COPY(&pcp_ip, &((struct sockaddr_in6 *)sa)->sin6_addr);
        pcp_port = ((struct sockaddr_in6 *)sa)->sin6_port;
        scope_id = ((struct sockaddr_in6 *)sa)->sin6_scope_id;
    }

    if (!pcp_port) {
        pcp_port = ntohs(PCP_SERVER_PORT);
    }

    pcps = get_pcp_server_by_ip(ctx, (struct in6_addr *)&pcp_ip, scope_id);
    if (!pcps) {
        int pcps_indx = pcp_new_server(ctx, &pcp_ip, pcp_port, scope_id);

        if (pcps_indx >= 0) {
            pcps = get_pcp_server(ctx, pcps_indx);
        }

        if (pcps == NULL) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s", "Can't add PCP server.\n");
            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return PCP_ERR_UNKNOWN;
        }
    } else {
        pcps->pcp_port = pcp_port;
    }

    pcps->pcp_version = version;
    pcps->server_state = pss_allocated;

    if (psd_fill_pcp_server_src(pcps)) {
        pcps->server_state = pss_unitialized;
        PCP_LOG(PCP_LOGLVL_INFO, "Failed to add PCP server %s",
                pcps->pcp_server_paddr);

        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return PCP_ERR_UNKNOWN;
    }

    PCP_LOG(PCP_LOGLVL_INFO, "Added PCP server %s", pcps->pcp_server_paddr);

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return (pcp_errno)pcps->index;
}